

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_socket.c
# Opt level: O0

ssize_t send_parts(int fd,msghdr *msg,int flags)

{
  size_t local_48;
  size_t minimum;
  ulong uStack_30;
  uint i;
  size_t remaining_bytes;
  uint len;
  int flags_local;
  msghdr *msg_local;
  int fd_local;
  
  remaining_bytes._0_4_ = 0;
  uStack_30 = bytes_to_send;
  minimum._4_4_ = 0;
  while( true ) {
    if (msg->msg_iovlen <= (ulong)minimum._4_4_) {
      return bytes_to_send;
    }
    if (uStack_30 < msg->msg_iov[minimum._4_4_].iov_len) {
      local_48 = uStack_30;
    }
    else {
      local_48 = msg->msg_iov[minimum._4_4_].iov_len;
    }
    memcpy(send_buffer + (uint)remaining_bytes,msg->msg_iov[minimum._4_4_].iov_base,local_48);
    remaining_bytes._0_4_ = (int)local_48 + (uint)remaining_bytes;
    uStack_30 = uStack_30 - local_48;
    if (uStack_30 == 0) break;
    minimum._4_4_ = minimum._4_4_ + 1;
  }
  return bytes_to_send;
}

Assistant:

static ssize_t send_parts(int fd, const struct msghdr *msg, int flags)
{
	(void)fd;
	(void)flags;
	unsigned int len = 0;
	size_t remaining_bytes = bytes_to_send;
	for (unsigned int i = 0; i < msg->msg_iovlen; i++) {
		size_t minimum = CIO_MIN(remaining_bytes, msg->msg_iov[i].iov_len);
		memcpy(&send_buffer[len], msg->msg_iov[i].iov_base, minimum);
		len += (unsigned int)minimum;
		remaining_bytes -= minimum;
		if (remaining_bytes == 0) {
			return (ssize_t)bytes_to_send;
		}
	}

	return (ssize_t)bytes_to_send;
}